

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

void absl::lts_20250127::functional_internal::
     InvokeObject<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatFPositiveExpSlow(absl::lts_20250127::uint128,int,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0,void,absl::lts_20250127::str_format_internal::(anonymous_namespace)::BinaryToDecimal>
               (VoidPtr ptr,type args)

{
  anon_class_8_1_a8a4b3b1 *o;
  type args_local;
  VoidPtr ptr_local;
  
  std::
  invoke<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatFPositiveExpSlow(absl::lts_20250127::uint128,int,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0_const&,absl::lts_20250127::str_format_internal::(anonymous_namespace)::BinaryToDecimal>
            ((anon_class_8_1_a8a4b3b1 *)ptr.obj,args);
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}